

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::EnergyReportMapToJson_abi_cxx11_
          (string *__return_storage_ptr__,commissioner *this,EnergyReportMap *aEnergyReportMap)

{
  json_value this_00;
  bool bVar1;
  reference this_01;
  string local_98;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_78 [2];
  EnergyReport *local_58;
  EnergyReport *report;
  Address *deviceAddr;
  pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport> *kv;
  const_iterator __end2;
  const_iterator __begin2;
  EnergyReportMap *__range2;
  Json json;
  EnergyReportMap *aEnergyReportMap_local;
  
  json.m_value = (json_value)this;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)&__range2,(nullptr_t)0x0);
  this_00 = json.m_value;
  __end2 = std::
           map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
           ::begin((map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
                    *)json.m_value.object);
  kv = (pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport> *)
       std::
       map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
       ::end((map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
              *)this_00.object);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&kv);
    if (!bVar1) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::dump(__return_storage_ptr__,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)&__range2,4,' ',false,strict);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&__range2);
      return __return_storage_ptr__;
    }
    report = (EnergyReport *)
             std::
             _Rb_tree_const_iterator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>
             ::operator*(&__end2);
    local_58 = &((reference)report)->second;
    deviceAddr = (Address *)report;
    bVar1 = Address::IsValid((Address *)report);
    if (!bVar1) break;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_ot::commissioner::EnergyReport_&,_ot::commissioner::EnergyReport,_0>
              (local_78,local_58);
    Address::ToString_abi_cxx11_(&local_98,(Address *)report);
    this_01 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)&__range2,&local_98);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(this_01,local_78);
    std::__cxx11::string::~string((string *)&local_98);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(local_78);
    std::
    _Rb_tree_const_iterator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>
    ::operator++(&__end2);
  }
  abort();
}

Assistant:

std::string EnergyReportMapToJson(const EnergyReportMap &aEnergyReportMap)
{
    Json json;

    // Manually create json object because the key is not std::string and
    // the JSON library will map `aEnergyReportMap` into JSON array.
    for (auto &kv : aEnergyReportMap)
    {
        auto &deviceAddr = kv.first;
        auto &report     = kv.second;

        VerifyOrDie(deviceAddr.IsValid());
        json[deviceAddr.ToString()] = report;
    }
    return json.dump(JSON_INDENT_DEFAULT);
}